

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

void write_flags(ang_file *fff,char *intro_text,bitflag *flags,int flag_size,char **names)

{
  size_t sVar1;
  int local_43c;
  char local_438 [4];
  int pointer;
  char buf [1024];
  int flag;
  char **names_local;
  int flag_size_local;
  bitflag *flags_local;
  char *intro_text_local;
  ang_file *fff_local;
  
  memset(local_438,0,0x400);
  local_43c = 0;
  for (buf._1020_4_ = flag_next(flags,(long)flag_size,1); buf._1020_4_ != 0;
      buf._1020_4_ = flag_next(flags,(long)flag_size,buf._1020_4_ + 1)) {
    sVar1 = strlen(local_438);
    if (sVar1 != 0) {
      my_strcat(local_438," | ",0x400);
      local_43c = local_43c + 3;
    }
    if (names[(int)buf._1020_4_] == (char *)0x0) break;
    my_strcat(local_438,names[(int)buf._1020_4_],0x400);
    sVar1 = strlen(names[(int)buf._1020_4_]);
    local_43c = local_43c + (int)sVar1;
    if (0x3b < local_43c) {
      file_putf(fff,"%s%s\n",intro_text,local_438);
      my_strcpy(local_438,"",0x400);
      local_43c = 0;
    }
  }
  if (local_43c != 0) {
    file_putf(fff,"%s%s\n",intro_text,local_438);
  }
  return;
}

Assistant:

void write_flags(ang_file *fff, const char *intro_text, const bitflag *flags,
					   int flag_size, const char *names[])
{
	int flag;
	char buf[1024] = "";
	int pointer = 0;

	/* Write flag name list */
	for (flag = flag_next(flags, flag_size, FLAG_START); flag != FLAG_END;
		 flag = flag_next(flags, flag_size, flag + 1)) {

		/* Write the flags, keeping track of where we are */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* If no name, we're past the real flags */
		if (!names[flag]) break;
		my_strcat(buf, names[flag], sizeof(buf));
		pointer += strlen(names[flag]);

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", intro_text, buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining flags if any */
	if (pointer)
		file_putf(fff, "%s%s\n", intro_text, buf);
}